

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

UConverter * ucnv_openCCSID_63(int32_t codepage,UConverterPlatform platform,UErrorCode *err)

{
  UConverter *pUVar1;
  uint *buffer;
  char myName [60];
  uint local_48;
  char local_44 [60];
  
  if (err != (UErrorCode *)0x0) {
    buffer = &local_48;
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      if (platform == UCNV_IBM) {
        buffer = (uint *)local_44;
        local_44[0] = '\0';
        local_48 = 0x2d6d6269;
      }
      else {
        local_48 = local_48 & 0xffffff00;
      }
      T_CString_integerToString_63((char *)buffer,codepage,10);
      pUVar1 = ucnv_createConverter_63((UConverter *)0x0,(char *)&local_48,err);
    }
    else {
      pUVar1 = (UConverter *)0x0;
    }
    return pUVar1;
  }
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter*   U_EXPORT2
ucnv_openCCSID (int32_t codepage,
                UConverterPlatform platform,
                UErrorCode * err)
{
    char myName[UCNV_MAX_CONVERTER_NAME_LENGTH];
    int32_t myNameLen;

    if (err == NULL || U_FAILURE (*err))
        return NULL;

    /* ucnv_copyPlatformString could return "ibm-" or "cp" */
    myNameLen = ucnv_copyPlatformString(myName, platform);
    T_CString_integerToString(myName + myNameLen, codepage, 10);

    return ucnv_createConverter(NULL, myName, err);
}